

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O2

exr_result_t
internal_encode_alloc_buffer
          (exr_encode_pipeline_t *encode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *cursz,size_t newsz)

{
  uint uVar1;
  exr_result_t eVar2;
  void *pvVar3;
  ulong uVar4;
  char *pcVar5;
  exr_const_context_t_conflict p_Var6;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if (newsz == 0) {
    p_Var6 = encode->context;
    if (p_Var6 == (exr_const_context_t)0x0) {
      return 2;
    }
    uVar1 = encode->part_index;
    uVar4 = (ulong)uVar1;
    if ((-1 < (int)uVar1) && ((int)uVar1 < p_Var6->num_parts)) {
      UNRECOVERED_JUMPTABLE = p_Var6->print_error;
      pcVar5 = "Attempt to allocate 0 byte buffer for transcode buffer %d";
      eVar2 = 3;
      uVar4 = (ulong)bufid;
      goto LAB_001264ca;
    }
  }
  else {
    if ((*buf != (void *)0x0) && (newsz <= *cursz)) {
      return 0;
    }
    internal_encode_free_buffer(encode,bufid,buf,cursz);
    if (encode->alloc_fn == (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0) {
      p_Var6 = encode->context;
      if (p_Var6 == (exr_const_context_t_conflict)0x0) {
        return 2;
      }
      uVar1 = encode->part_index;
      uVar4 = (ulong)uVar1;
      if (((int)uVar1 < 0) || (p_Var6->num_parts <= (int)uVar1)) {
        UNRECOVERED_JUMPTABLE = p_Var6->print_error;
        pcVar5 = "Part index (%d) out of range";
        eVar2 = 4;
        goto LAB_001264ca;
      }
      pvVar3 = (*p_Var6->alloc_fn)(newsz);
    }
    else {
      pvVar3 = (*encode->alloc_fn)(bufid,newsz);
    }
    if (pvVar3 != (void *)0x0) {
      *buf = pvVar3;
      *cursz = newsz;
      return 0;
    }
    p_Var6 = encode->context;
    if (p_Var6 == (exr_const_context_t)0x0) {
      return 2;
    }
    uVar1 = encode->part_index;
    uVar4 = (ulong)uVar1;
    if ((-1 < (int)uVar1) && ((int)uVar1 < p_Var6->num_parts)) {
      eVar2 = (*p_Var6->print_error)
                        (p_Var6,1,"Unable to allocate %lu bytes",newsz,p_Var6->print_error);
      return eVar2;
    }
  }
  UNRECOVERED_JUMPTABLE = p_Var6->print_error;
  pcVar5 = "Part index (%d) out of range";
  eVar2 = 4;
LAB_001264ca:
  eVar2 = (*UNRECOVERED_JUMPTABLE)(p_Var6,eVar2,pcVar5,uVar4,UNRECOVERED_JUMPTABLE);
  return eVar2;
}

Assistant:

exr_result_t
internal_encode_alloc_buffer (
    exr_encode_pipeline_t*               encode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              cursz,
    size_t                               newsz)
{
    void* curbuf = *buf;
    if (newsz == 0)
    {
        exr_const_context_t ctxt = encode->context;
        EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attempt to allocate 0 byte buffer for transcode buffer %d",
            (int) bufid);
    }

    if (!curbuf || *cursz < newsz)
    {
        internal_encode_free_buffer (encode, bufid, buf, cursz);

        if (encode->alloc_fn)
            curbuf = encode->alloc_fn (bufid, newsz);
        else
        {
            exr_const_context_t ctxt = encode->context;
            EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

            curbuf = ctxt->alloc_fn (newsz);
        }

        if (curbuf == NULL)
        {
            exr_const_context_t ctxt = encode->context;
            EXR_CHECK_CONTEXT_AND_PART (encode->part_index);

            return ctxt->print_error (
                ctxt,
                EXR_ERR_OUT_OF_MEMORY,
                "Unable to allocate %" PRIu64 " bytes",
                (uint64_t) newsz);
        }

        *buf   = curbuf;
        *cursz = newsz;
    }
    return EXR_ERR_SUCCESS;
}